

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.h
# Opt level: O2

ostream * pstack::operator<<(ostream *os,JSON<pstack::Field<char[6],_pstack::Dwarf::Units>,_char> *o
                            )

{
  ostream *poVar1;
  JSON<char[6],_char> local_38;
  JSON<pstack::Dwarf::Units,_char> local_28;
  char local_11;
  
  local_38.object = o->object->k;
  local_38.context = &local_11;
  local_11 = '\0';
  poVar1 = operator<<(os,&local_38);
  poVar1 = std::operator<<(poVar1,":");
  local_28.context = o->context;
  local_28.object = o->object->v;
  poVar1 = operator<<(poVar1,&local_28);
  return poVar1;
}

Assistant:

std::ostream &
operator << (std::ostream &os, const JSON<Field<K,V>, C> &o)
{
   return os << json(o.object.k) << ":" << json(o.object.v, o.context);
}